

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O1

void ppc_cpu_do_unaligned_access_ppc64
               (CPUState *cs,vaddr vaddr,MMUAccessType access_type,int mmu_idx,uintptr_t retaddr)

{
  CPUArchState_conflict23 *env;
  uint32_t uVar1;
  
  env = (CPUArchState_conflict23 *)cs->env_ptr;
  cpu_restore_state_ppc64(cs,retaddr,true);
  uVar1 = cpu_ldl_code_ppc64(env,env->nip);
  cs->exception_index = 5;
  env->error_code = uVar1 & 0x3ff0000;
  cpu_loop_exit_ppc64(cs);
}

Assistant:

void ppc_cpu_do_unaligned_access(CPUState *cs, vaddr vaddr,
                                 MMUAccessType access_type,
                                 int mmu_idx, uintptr_t retaddr)
{
    CPUPPCState *env = cs->env_ptr;
    uint32_t insn;

    /* Restore state and reload the insn we executed, for filling in DSISR.  */
    cpu_restore_state(cs, retaddr, true);
    insn = cpu_ldl_code(env, env->nip);

    cs->exception_index = POWERPC_EXCP_ALIGN;
    env->error_code = insn & 0x03FF0000;
    cpu_loop_exit(cs);
}